

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupLastPis(Gia_Man_t *p,int nLastPis)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint local_3c;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nLastPis_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x23d,"Gia_Man_t *Gia_ManDupLastPis(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCi(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ManCiNum(p);
    if (local_2c < iVar1 - nLastPis) {
      local_3c = 0xffffffff;
    }
    else {
      local_3c = Gia_ManAppendCi(p_00);
    }
    pGStack_28->Value = local_3c;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    bVar5 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iLit1 = Gia_ObjFanin1Copy(pGStack_28);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      pGStack_28->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_28->Value = uVar2;
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLastPis( Gia_Man_t * p, int nLastPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i < Gia_ManCiNum(p) - nLastPis) ? ~0 : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}